

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_Parse(char *value)

{
  char *pcVar1;
  cJSON *item;
  char *pcVar2;
  
  item = (cJSON *)(*cJSON_malloc)(0x40);
  if (item == (cJSON *)0x0) {
    ep = (char *)0x0;
  }
  else {
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    ep = (char *)0x0;
    if (value == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = value + -1;
      do {
        pcVar1 = pcVar2 + 1;
        pcVar2 = pcVar2 + 1;
      } while ((byte)(*pcVar1 - 1U) < 0x20);
    }
    pcVar2 = parse_value(item,pcVar2);
    if (pcVar2 != (char *)0x0) {
      return item;
    }
    cJSON_Delete(item);
  }
  return (cJSON *)0x0;
}

Assistant:

cJSON *cJSON_Parse(const char *value)
{
	cJSON *c=cJSON_New_Item();
	ep=0;
	if (!c) return 0;       /* memory fail */

	if (!parse_value(c,skip(value))) {cJSON_Delete(c);return 0;}
	return c;
}